

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cauchy_256.cpp
# Opt level: O0

u64 * generate_bitmatrix(int k,Block **recovery,int recovery_count,u8 *matrix,int stride,
                        u8 *erasures,int *bitstride)

{
  undefined1 auVar1 [16];
  byte *pbVar2;
  byte bVar3;
  ulong uVar4;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  int in_R8D;
  byte *in_R9;
  int ii_4;
  u64 *out;
  int ii_3;
  int shift;
  int ii_2;
  u8 slice;
  u64 w [8];
  int limit;
  u8 *erasure;
  int remaining;
  u8 *row;
  int x;
  int ii_1;
  u64 pattern;
  int recovery_row;
  Block *recovery_block;
  int ii;
  u64 *bitrow;
  u64 *bitmatrix;
  int bitrows;
  int local_f4;
  u64 *local_f0;
  int local_e8;
  int local_e0;
  byte local_d9;
  ulong local_d8 [9];
  int local_8c;
  byte *local_88;
  int local_7c;
  long local_78;
  int local_70;
  int local_6c;
  u64 local_68;
  int local_5c;
  long local_58;
  int local_4c;
  u64 *local_48;
  u64 *local_40;
  int local_34;
  byte *local_30;
  int local_24;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  local_34 = in_EDX * 8;
  *(int *)out = (local_34 + 0x3f) / 0x40;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)((int)*out * local_34);
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  local_40 = (u64 *)operator_new__(uVar4);
  local_48 = local_40;
  for (local_4c = 0; local_4c < local_14; local_4c = local_4c + 1) {
    local_58 = *(long *)(local_10 + (long)local_4c * 8);
    local_5c = (uint)*(byte *)(local_58 + 8) - local_4;
    if (local_5c == 0) {
      local_68 = 0x101010101010101;
      local_6c = 0;
      while (local_6c < 8) {
        for (local_70 = 0; local_70 < (int)*out; local_70 = local_70 + 1) {
          local_48[local_70] = local_68;
        }
        local_6c = local_6c + 1;
        local_68 = local_68 << 1;
        local_48 = local_48 + (int)*out;
      }
    }
    else {
      local_78 = local_20 + (local_5c + -1) * local_24;
      local_7c = local_14;
      local_88 = local_30;
      while (pbVar2 = local_88, 0 < local_7c) {
        local_8c = local_7c;
        if (8 < local_7c) {
          local_8c = 8;
        }
        local_7c = local_7c - local_8c;
        local_88 = local_88 + 1;
        local_d9 = *(byte *)(local_78 + (ulong)*pbVar2);
        local_d8[0] = (ulong)local_d9;
        for (local_e0 = 1; local_e0 < 8; local_e0 = local_e0 + 1) {
          local_d9 = GFC256Multiply(local_d9,'\x02');
          local_d8[local_e0] = (ulong)local_d9;
        }
        bVar3 = 8;
        while (pbVar2 = local_88, local_8c = local_8c + -1, 0 < local_8c) {
          local_88 = local_88 + 1;
          local_d9 = *(byte *)(local_78 + (ulong)*pbVar2);
          local_d8[0] = (ulong)local_d9 << (bVar3 & 0x3f) | local_d8[0];
          for (local_e8 = 1; local_e8 < 8; local_e8 = local_e8 + 1) {
            local_d9 = GFC256Multiply(local_d9,'\x02');
            local_d8[local_e8] = (ulong)local_d9 << (bVar3 & 0x3f) | local_d8[local_e8];
          }
          bVar3 = bVar3 + 8;
        }
        local_f0 = local_48;
        for (local_f4 = 0; local_f4 < 8; local_f4 = local_f4 + 1) {
          *local_f0 = local_d8[local_f4];
          local_f0 = local_f0 + (int)*out;
        }
        local_48 = local_48 + 1;
      }
      local_48 = local_48 + (int)*out * 7;
    }
    *(byte *)(local_58 + 8) = local_30[local_4c];
  }
  return local_40;
}

Assistant:

static u64 *generate_bitmatrix(int k, Block *recovery[256], int recovery_count,
						const u8 *matrix, int stride, const u8 erasures[256],
						int &bitstride)
{
	// Allocate the bitmatrix
	int bitrows = recovery_count * 8;
	bitstride = (bitrows + 63) / 64;
	u64 *bitmatrix = new u64[bitstride * bitrows];
	u64 *bitrow = bitmatrix;

	// For each recovery block,
	for (int ii = 0; ii < recovery_count; ++ii) {
		Block *recovery_block = recovery[ii];

		// If first row of matrix,
		int recovery_row = recovery_block->row - k;
		if (recovery_row == 0) {
			// Write 8x8 identity submatrix pattern across each bit row
			u64 pattern = 0x0101010101010101ULL;

			for (int ii = 0; ii < 8; ++ii, pattern <<= 1, bitrow += bitstride) {
				for (int x = 0; x < bitstride; ++x) {
					bitrow[x] = pattern;
				}
			}
		} else {
			const u8 *row = matrix + (recovery_row - 1) * stride;
			int remaining = recovery_count;
			const u8 *erasure = erasures;

			// Otherwise read the elements of the matrix:

			DLOG(cout << "For recovery row " << recovery_row << endl;)

			// Generate eight 64-bit columns of the bitmatrix at a time
			while (remaining > 0) {
				// Take up to 8 columns at a time
				int limit = remaining;
				if (limit > 8) {
					limit = 8;
				}
				remaining -= limit;

				// Unroll first loop
				u64 w[8];
				u8 slice = row[*erasure++];
				w[0] = (u64)slice;

				DLOG(cout << "+ Generating 8x8 submatrix from slice=" << (int)slice << endl;)

				for (int ii = 1; ii < 8; ++ii) {
					slice = GFC256Multiply(slice, 2);
					w[ii] = (u64)slice;
				}

				// For each remaining 8 bit slice,
				for (int shift = 8; --limit > 0; shift += 8) {
					slice = row[*erasure++];
					DLOG(cout << "+ Generating 8x8 submatrix from slice=" << (int)slice << endl;)
					w[0] |= (u64)slice << shift;

					for (int ii = 1; ii < 8; ++ii) {
						slice = GFC256Multiply(slice, 2);
						w[ii] |= (u64)slice << shift;
					}
				}

				// Write 64-bit column of bitmatrix
				u64 *out = bitrow;
				for (int ii = 0; ii < 8; ++ii, out += bitstride) {
					out[0] = w[ii];
				}
				++bitrow;
			}

			bitrow += bitstride * 7;
		}

		// Set the row to what the final recovered row will be
		recovery_block->row = erasures[ii];
	}

	return bitmatrix;
}